

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.h
# Opt level: O1

void __thiscall clean_up_fixture::~clean_up_fixture(clean_up_fixture *this)

{
  pointer pcVar1;
  uint local_10;
  
  boost::filesystem::detail::status((path *)&stack0xfffffffffffffff0,(error_code *)this);
  if (1 < local_10) {
    boost::filesystem::detail::remove_all(&this->m_path,(error_code *)0x0);
  }
  pcVar1 = (this->m_path).m_pathname._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_path).m_pathname.field_2) {
    operator_delete(pcVar1);
  }
  return;
}

Assistant:

~clean_up_fixture()
    {
        if(exists())
        {
            try
            {
                fs::remove_all(m_path);
            }
            catch (...) {
            }
        }
    }